

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

void Gia_ManProfileStructuresInt(Gia_Man_t *p,int nLimit,int fVerbose)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  Vec_Int_t *vArray;
  int *piVar4;
  Vec_Int_t *vCode;
  Vec_Int_t *p_00;
  Vec_Int_t *__ptr;
  void *pvVar5;
  Gia_Obj_t *pGVar6;
  int *__ptr_00;
  int iVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  char *pcVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  uint *local_78;
  uint *local_58;
  uint *local_50;
  uint *local_40;
  
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMuxes.c"
                  ,0x35f,"void Gia_ManProfileStructuresInt(Gia_Man_t *, int, int)");
  }
  Gia_ManStaticFanoutStart(p);
  vArray = (Vec_Int_t *)malloc(0x10);
  vArray->nCap = 100;
  vArray->nSize = 0;
  piVar4 = (int *)malloc(400);
  vArray->pArray = piVar4;
  iVar3 = p->nObjs;
  vCode = (Vec_Int_t *)malloc(0x10);
  iVar7 = iVar3 * 5;
  if (iVar3 * 5 - 1U < 0xf) {
    iVar7 = 0x10;
  }
  vCode->nSize = 0;
  vCode->nCap = iVar7;
  if (iVar7 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar7 << 2);
  }
  vCode->pArray = piVar4;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar7 = iVar3;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar7;
  iVar14 = 0;
  if (iVar7 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar7 << 2);
  }
  p_00->pArray = piVar4;
  if (0 < iVar3) {
    pGVar6 = p->pObjs;
    if (pGVar6 != (Gia_Obj_t *)0x0) {
      lVar8 = 0;
      do {
        Vec_IntPush(p_00,vCode->nSize);
        uVar16 = *(ulong *)pGVar6;
        iVar3 = (int)uVar16;
        if (((uVar16 & 0x1fffffff) == 0x1fffffff || -1 < iVar3) ||
           ((int)((uint)(uVar16 >> 0x20) & 0x1fffffff) < p->vCos->nSize - p->nRegs)) {
          pGVar2 = p->pObjs;
          if ((pGVar6 < pGVar2) || (pGVar2 + p->nObjs <= pGVar6)) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          if ((p->pMuxes == (uint *)0x0) ||
             (uVar10 = 3,
             p->pMuxes[(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555] == 0)) {
            iVar7 = (int)(uVar16 & 0x1fffffff);
            uVar10 = 2;
            if (iVar3 < 0 || iVar7 == 0x1fffffff) {
              uVar10 = (ulong)(iVar3 < 0 && iVar7 != 0x1fffffff);
            }
          }
          iVar3 = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555;
          if ((-1 < iVar3) && (iVar3 < p->vFanoutNums->nSize)) {
            iVar3 = Gia_ManEncodeObj(p,(int)lVar8);
            Vec_IntPush(vCode,iVar3);
            (*(code *)(&DAT_00957160 + *(int *)(&DAT_00957160 + uVar10 * 4)))();
            return;
          }
          goto LAB_002228c8;
        }
        lVar8 = lVar8 + 1;
        iVar3 = p->nObjs;
      } while ((lVar8 < iVar3) && (pGVar6 = p->pObjs + lVar8, p->pObjs != (Gia_Obj_t *)0x0));
    }
    iVar14 = p_00->nSize;
  }
  if (iVar14 != iVar3) {
    __assert_fail("Vec_IntSize(vCodeOffsets) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMuxes.c"
                  ,0x393,"void Gia_ManProfileStructuresInt(Gia_Man_t *, int, int)");
  }
  Vec_IntPush(p_00,vCode->nSize);
  if (fVerbose != 0) {
    pcVar13 = "Showing TFI/node/TFO structures for all nodes:";
    puts("Showing TFI/node/TFO structures for all nodes:");
    if (0 < p->nObjs) {
      iVar3 = 0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        Gia_ManProfileCollect((Gia_Man_t *)pcVar13,iVar3,vCode,p_00,vArray);
        pcVar13 = (char *)p;
        Gia_ManProfilePrintOne(p,iVar3,vArray);
        iVar3 = iVar3 + 1;
      } while (iVar3 < p->nObjs);
    }
  }
  __ptr = Gia_ManProfileHash(p,vCode,p_00);
  uVar1 = __ptr->nSize;
  uVar16 = (ulong)uVar1;
  if (uVar16 == 0) {
    local_50 = (uint *)malloc(0x10);
    uVar15 = 0;
    uVar9 = 1;
LAB_00222505:
    local_58 = local_50 + 1;
    *local_50 = 0x10;
    uVar12 = 0x10;
LAB_0022251c:
    pvVar5 = malloc((long)(int)uVar12 << 2);
    *(void **)(local_50 + 2) = pvVar5;
    local_50[1] = uVar9;
    if (pvVar5 != (void *)0x0) {
      memset(pvVar5,0,(long)(int)uVar9 * 4);
    }
    local_78 = (uint *)malloc(0x10);
    local_40 = local_78 + 1;
    *local_78 = uVar12;
    pvVar5 = malloc((long)(int)uVar12 << 2);
    *(void **)(local_78 + 2) = pvVar5;
    local_78[1] = uVar9;
    if (pvVar5 == (void *)0x0) {
      pvVar5 = (void *)0x0;
    }
    else {
      memset(pvVar5,0,(long)(int)uVar9 << 2);
    }
  }
  else {
    uVar15 = *__ptr->pArray;
    if (1 < (int)uVar1) {
      uVar10 = 1;
      do {
        uVar9 = __ptr->pArray[uVar10];
        if ((int)uVar15 <= (int)uVar9) {
          uVar15 = uVar9;
        }
        uVar10 = uVar10 + 1;
      } while (uVar16 != uVar10);
    }
    uVar9 = uVar15 + 1;
    local_50 = (uint *)malloc(0x10);
    if (uVar15 < 0xf) goto LAB_00222505;
    local_58 = local_50 + 1;
    *local_50 = uVar9;
    uVar12 = uVar9;
    if (uVar9 != 0) goto LAB_0022251c;
    local_50[2] = 0;
    local_50[3] = 0;
    local_50[1] = 0;
    local_78 = (uint *)calloc(1,0x10);
    local_40 = local_78 + 1;
    uVar15 = 0xffffffff;
    pvVar5 = (void *)0x0;
    uVar9 = 0;
  }
  iVar3 = p->nObjs;
  if ((0 < iVar3) && (pGVar6 = p->pObjs, pGVar6 != (Gia_Obj_t *)0x0)) {
    uVar10 = 0;
    if ((int)uVar1 < 1) {
      uVar16 = uVar10;
    }
    do {
      if (uVar16 == uVar10) goto LAB_002228c8;
      uVar1 = __ptr->pArray[uVar10];
      uVar11 = (ulong)uVar1;
      uVar12 = (uint)*(undefined8 *)pGVar6;
      if (((~uVar12 & 0x1fffffff) == 0 || -1 < (int)uVar12) ||
         ((int)((uint)((ulong)*(undefined8 *)pGVar6 >> 0x20) & 0x1fffffff) <
          p->vCos->nSize - p->nRegs)) {
        if (((int)uVar1 < 0) || ((int)*local_58 <= (int)uVar1)) goto LAB_002228c8;
        lVar8 = *(long *)(local_50 + 2);
        iVar3 = *(int *)(lVar8 + uVar11 * 4);
        if (iVar3 == 0) {
          if ((int)uVar9 <= (int)uVar1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(int *)((long)pvVar5 + uVar11 * 4) = (int)uVar10;
          iVar3 = *(int *)(lVar8 + uVar11 * 4);
        }
        *(int *)(lVar8 + uVar11 * 4) = iVar3 + -1;
        iVar3 = p->nObjs;
      }
      uVar10 = uVar10 + 1;
      pGVar6 = pGVar6 + 1;
    } while ((long)uVar10 < (long)iVar3);
    uVar9 = *local_58;
  }
  piVar4 = *(int **)(local_50 + 2);
  __ptr_00 = Abc_MergeSortCost(piVar4,uVar9);
  printf("Showing TFI/node/TFO structures that appear more than %d times.\n",(ulong)(uint)nLimit);
  if ((int)uVar15 < 1) {
    if (__ptr_00 == (int *)0x0) goto LAB_0022280d;
  }
  else {
    uVar16 = 0;
LAB_002226fa:
    iVar3 = __ptr_00[uVar16];
    if (((long)iVar3 < 0) || ((int)uVar9 <= iVar3)) {
LAB_002228c8:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if (nLimit <= -piVar4[iVar3]) {
      printf("%6d : ",uVar16 & 0xffffffff);
      printf("%6d : ",(ulong)(uint)__ptr_00[uVar16]);
      uVar1 = __ptr_00[uVar16];
      if (((long)(int)uVar1 < 0) || (uVar9 <= uVar1)) goto LAB_002228c8;
      printf("Weight =%6d  ",(ulong)(uint)-piVar4[(int)uVar1]);
      pcVar13 = "First obj =";
      printf("First obj =");
      iVar3 = __ptr_00[uVar16];
      if (((long)iVar3 < 0) || (uVar1 = *local_40, (int)uVar1 <= iVar3)) goto LAB_002228c8;
      lVar8 = *(long *)(local_78 + 2);
      Gia_ManProfileCollect
                ((Gia_Man_t *)pcVar13,*(int *)(lVar8 + (long)iVar3 * 4),vCode,p_00,vArray);
      uVar12 = __ptr_00[uVar16];
      if (((long)(int)uVar12 < 0) || (uVar1 <= uVar12)) goto LAB_002228c8;
      Gia_ManProfilePrintOne(p,*(int *)(lVar8 + (long)(int)uVar12 * 4),vArray);
      uVar16 = uVar16 + 1;
      if (uVar15 != uVar16) goto LAB_002226fa;
    }
  }
  free(__ptr_00);
LAB_0022280d:
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(local_50);
  if (*(void **)(local_78 + 2) != (void *)0x0) {
    free(*(void **)(local_78 + 2));
  }
  free(local_78);
  if (vArray->pArray != (int *)0x0) {
    free(vArray->pArray);
  }
  free(vArray);
  if (vCode->pArray != (int *)0x0) {
    free(vCode->pArray);
  }
  free(vCode);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  Gia_ManStaticFanoutStop(p);
  return;
}

Assistant:

void Gia_ManProfileStructuresInt( Gia_Man_t * p, int nLimit, int fVerbose )
{
    Vec_Int_t * vRes, * vCount, * vFirst;
    Vec_Int_t * vCode, * vCodeOffsets, * vArray;
    Gia_Obj_t * pObj, * pFanout;
    int i, k, nFanins, nFanouts, * pPerm, nClasses;
    assert( p->pMuxes );
    Gia_ManStaticFanoutStart( p );
    // create fanout codes
    vArray = Vec_IntAlloc( 100 );
    vCode = Vec_IntAlloc( 5 * Gia_ManObjNum(p) );
    vCodeOffsets = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        Vec_IntPush( vCodeOffsets, Vec_IntSize(vCode) );
        if ( Gia_ObjIsRi(p, pObj) )
            continue;
        nFanins = Gia_ObjFaninNum(p, pObj);
        nFanouts = Gia_ObjFanoutNum(p, pObj);
        Vec_IntPush( vCode, Gia_ManEncodeObj(p, i) );
        if ( nFanins == 3 )
        {
            int iLit = Gia_ObjFaninLit2p(p, pObj);
            Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Abc_LitRegular(iLit)) );
            if ( Abc_LitIsCompl(iLit) )
            {
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj)) );
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit1p(p, pObj)) );
            }
            else
            {
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit1p(p, pObj)) );
                Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj)) );
            }
        }
        else if ( nFanins == 2 )
        {
            int Code0 = Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj));
            int Code1 = Gia_ManEncodeFanin(p, Gia_ObjFaninLit1p(p, pObj));
            Vec_IntPush( vCode, Code0 < Code1 ? Code0 : Code1 );
            Vec_IntPush( vCode, Code0 < Code1 ? Code1 : Code0 );
        }
        else if ( nFanins == 1 )
            Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, pObj)) );
        else if ( Gia_ObjIsRo(p, pObj) )
            Vec_IntPush( vCode, Gia_ManEncodeFanin(p, Gia_ObjFaninLit0p(p, Gia_ObjRoToRi(p, pObj))) );

        // add fanouts
        Vec_IntClear( vArray );
        Gia_ObjForEachFanoutStatic( p, pObj, pFanout, k )
        {
            int Index = Gia_ObjWhatFanin( p, pFanout, pObj );
            Gia_ObjType_t Type = Gia_ManEncodeFanout( p, pFanout, Index );
            Vec_IntPush( vArray, Type );
        }
        Vec_IntSort( vArray, 0 );
        Vec_IntAppend( vCode, vArray );
    }
    assert( Vec_IntSize(vCodeOffsets) == Gia_ManObjNum(p) );
    Vec_IntPush( vCodeOffsets, Vec_IntSize(vCode) );
    // print the results
    if ( fVerbose )
    {
        printf( "Showing TFI/node/TFO structures for all nodes:\n" );
        Gia_ManForEachObj( p, pObj, i )
        {
            Gia_ManProfileCollect( p, i, vCode, vCodeOffsets, vArray );
            Gia_ManProfilePrintOne( p, i, vArray );
        }
    }

    // collect statistics
    vRes = Gia_ManProfileHash( p, vCode, vCodeOffsets );
    //Vec_IntPrint( vRes );

    // count how many times each class appears
    nClasses = Vec_IntFindMax(vRes) + 1;
    vCount = Vec_IntStart( nClasses );
    vFirst = Vec_IntStart( nClasses );
    Gia_ManForEachObj( p, pObj, i )
    {
        int Entry = Vec_IntEntry( vRes, i );
        if ( Gia_ObjIsRi(p, pObj) )
            continue;
        if ( Vec_IntEntry(vCount, Entry) == 0 )
            Vec_IntWriteEntry( vFirst, Entry, i );
        Vec_IntAddToEntry( vCount, Entry, -1 );
    }
    // sort the counts
    pPerm = Abc_MergeSortCost( Vec_IntArray(vCount), Vec_IntSize(vCount) );
    printf( "Showing TFI/node/TFO structures that appear more than %d times.\n", nLimit );
    for ( i = 0; i < nClasses-1; i++ )
    {
        if ( nLimit > -Vec_IntEntry(vCount, pPerm[i]) )
            break;
        printf( "%6d : ", i );
        printf( "%6d : ", pPerm[i] );
        printf( "Weight =%6d  ",   -Vec_IntEntry(vCount, pPerm[i]) );
        printf( "First obj =" );
        // print the object
        Gia_ManProfileCollect( p, Vec_IntEntry(vFirst, pPerm[i]), vCode, vCodeOffsets, vArray );
        Gia_ManProfilePrintOne( p, Vec_IntEntry(vFirst, pPerm[i]), vArray );
    }

    // cleanup
    ABC_FREE( pPerm );
    Vec_IntFree( vRes );
    Vec_IntFree( vCount );
    Vec_IntFree( vFirst );

    Vec_IntFree( vArray );
    Vec_IntFree( vCode );
    Vec_IntFree( vCodeOffsets );
    Gia_ManStaticFanoutStop( p );
}